

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coordinate.cpp
# Opt level: O2

bool BLH2XYZ(BLH blh,ELLIPSOID ellipsoid,XYZ *xyz)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = (blh.B * 3600.0) / 206264.80624709636;
  dVar5 = (blh.L * 3600.0) / 206264.80624709636;
  dVar2 = sin(dVar1);
  dVar3 = cos(dVar1);
  dVar4 = sin(dVar5);
  dVar5 = cos(dVar5);
  dVar1 = sin(dVar1);
  dVar1 = 1.0 - dVar1 * ellipsoid.e2 * dVar1;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  if (1e-06 < dVar1) {
    dVar3 = dVar3 * (ellipsoid.a / dVar1 + blh.H);
    xyz->X = dVar3 * dVar5;
    xyz->Y = dVar3 * dVar4;
    xyz->Z = dVar2 * ((1.0 - ellipsoid.e2) * (ellipsoid.a / dVar1) + blh.H);
  }
  return 1e-06 < dVar1;
}

Assistant:

bool BLH2XYZ(const BLH blh, const ELLIPSOID ellipsoid, XYZ &xyz)
{
    double B_rad = Deg2Rad(blh.B);
    double L_rad = Deg2Rad(blh.L);
    double sinB = sin(B_rad);
    double cosB = cos(B_rad);
    double sinL = sin(L_rad);
    double cosL = cos(L_rad);

    double N;
    bool flag = GetN(blh, ellipsoid, N);
    if(!flag)
        return flag;
    
    xyz.X = (N + blh.H) * cosB * cosL;
    xyz.Y = (N + blh.H) * cosB * sinL;
    xyz.Z = (N * (1 - ellipsoid.e2) + blh.H) * sinB;

    return true;
}